

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_buf.c
# Opt level: O2

void * uo_buf_memcpy_append(uo_buf *buf,void *src,size_t size)

{
  long lVar1;
  uo_buf buf_00;
  
  buf_00 = *buf;
  while (lVar1 = *(long *)(buf_00 + -8), *(long *)(buf_00 + -0x10) - lVar1 <= (long)size) {
    buf_00 = uo_buf_realloc_2x(buf_00);
    *buf = buf_00;
  }
  memcpy(buf_00 + lVar1,src,size);
  *(size_t *)(buf_00 + -8) = *(long *)(buf_00 + -8) + size;
  return buf_00 + lVar1;
}

Assistant:

void *uo_buf_memcpy_append(
    uo_buf *restrict buf,
    const void *restrict src, 
    size_t size)
{
    while (uo_buf_get_len_after_ptr(*buf) <= (ptrdiff_t)size)
        *buf = uo_buf_realloc_2x(*buf);

    void *dst = memcpy(uo_buf_get_ptr(*buf), src, size);

    uo_buf_set_ptr_rel(*buf, size);

    return dst;
}